

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WasmByteCodeGenerator.cpp
# Opt level: O3

void __thiscall
Wasm::WasmBytecodeGenerator::YieldToBlock
          (WasmBytecodeGenerator *this,BlockInfo *blockInfo,PolymorphicEmitInfo polyExpr)

{
  IWasmByteCodeWriter *pIVar1;
  bool bVar2;
  OpCodeAsmJs OVar3;
  EmitInfo EVar4;
  WasmCompilationException *this_00;
  uint uVar5;
  ulong uVar6;
  uint32 index;
  PolymorphicEmitInfo other;
  undefined1 auStack_68 [8];
  PolymorphicEmitInfo polyYieldInfo;
  undefined1 local_50 [8];
  PolymorphicEmitInfo polyExpr_local;
  
  polyExpr_local._0_8_ = polyExpr.field_1;
  uVar5 = polyExpr.count;
  if ((blockInfo->yieldInfo).count != 0) {
    if (uVar5 != 0) {
      if (uVar5 == 1) {
        if (polyExpr.field_1._4_4_ == 8) {
          return;
        }
      }
      else {
        uVar6 = 0;
        do {
          if (((EmitInfo *)(polyExpr_local._0_8_ + uVar6 * 8))->type == Any) {
            return;
          }
          uVar6 = uVar6 + 1;
        } while (uVar5 != uVar6);
      }
    }
    auStack_68._0_4_ = (blockInfo->yieldInfo).count;
    auStack_68._4_4_ = *(undefined4 *)&(blockInfo->yieldInfo).field_0x4;
    polyYieldInfo._0_8_ = (blockInfo->yieldInfo).field_1;
    other._4_4_ = 0;
    other.count = uVar5;
    other.field_1.infos = (EmitInfo *)polyExpr_local._0_8_;
    local_50._0_4_ = uVar5;
    bVar2 = PolymorphicEmitInfo::IsEquivalent((PolymorphicEmitInfo *)auStack_68,other);
    if (!bVar2) {
      this_00 = (WasmCompilationException *)__cxa_allocate_exception(8);
      WasmCompilationException::WasmCompilationException(this_00,L"Invalid yield type");
      __cxa_throw(this_00,&WasmCompilationException::typeinfo,
                  WasmCompilationException::~WasmCompilationException);
    }
    if ((this->isUnreachable == false) && (blockInfo->didYield = true, uVar5 != 0)) {
      index = 0;
      do {
        EVar4 = PolymorphicEmitInfo::GetInfo((PolymorphicEmitInfo *)local_50,index);
        polyExpr_local.field_1.singleInfo =
             PolymorphicEmitInfo::GetInfo((PolymorphicEmitInfo *)auStack_68,index);
        pIVar1 = this->m_writer;
        OVar3 = GetReturnOp(this,EVar4.type);
        (*pIVar1->_vptr_IWasmByteCodeWriter[0xf])
                  (pIVar1,(ulong)OVar3,polyExpr_local.field_1.infos,(ulong)EVar4 & 0xffffffff);
        index = index + 1;
      } while (uVar5 != index);
    }
  }
  return;
}

Assistant:

void WasmBytecodeGenerator::YieldToBlock(BlockInfo* blockInfo, PolymorphicEmitInfo polyExpr)
{
    if (blockInfo->HasYield() && !polyExpr.IsUnreachable())
    {
        PolymorphicEmitInfo polyYieldInfo = blockInfo->yieldInfo;

        if (!polyYieldInfo.IsEquivalent(polyExpr))
        {
            throw WasmCompilationException(_u("Invalid yield type"));
        }

        if (!IsUnreachable())
        {
            blockInfo->didYield = true;
            for (uint32 i = 0; i < polyExpr.Count(); ++i)
            {
                EmitInfo expr = polyExpr.GetInfo(i);
                EmitInfo yieldInfo = polyYieldInfo.GetInfo(i);
                m_writer->AsmReg2(GetReturnOp(expr.type), yieldInfo.location, expr.location);
            }
        }
    }
}